

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O2

bool __thiscall
soul::SimpleTokeniser::skipPastMatchingCloseDelimiter
          (SimpleTokeniser *this,TokenType openDelim,TokenType closeDelim)

{
  bool bVar1;
  bool bVar2;
  TokenType token;
  int local_4c;
  TokenType local_48;
  TokenType local_40;
  TokenType local_38;
  
  local_4c = 0;
  local_40.text = closeDelim.text;
  local_38.text = openDelim.text;
  do {
    while( true ) {
      bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matches(&this->super_SOULTokeniser,(TokenType)0x2c8da6);
      if (bVar1) goto LAB_0021eb11;
      local_48 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                 ::skip(&this->super_SOULTokeniser);
      bVar2 = TokenType::operator==(&local_48,&local_38);
      if (!bVar2) break;
      local_4c = local_4c + 1;
    }
    bVar2 = TokenType::operator==(&local_48,&local_40);
  } while ((!bVar2) || (local_4c = local_4c + -1, local_4c != 0));
LAB_0021eb11:
  return !bVar1;
}

Assistant:

bool skipPastMatchingCloseDelimiter (TokenType openDelim, TokenType closeDelim)
    {
        int depth = 0;

        for (;;)
        {
            if (matches (Token::eof))
                return false;

            auto token = skip();

            if (token == openDelim)
            {
                ++depth;
            }
            else if (token == closeDelim)
            {
                if (--depth == 0)
                    return true;
            }
        }
    }